

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::
write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>
          (buffer_appender<char> out,decimal_fp<double> *fp,basic_format_specs<char> *specs,
          float_specs fspecs,char decimal_point)

{
  bool bVar1;
  type tVar2;
  int *piVar3;
  buffer_appender<char> it;
  float_specs in_RCX;
  int *in_RDX;
  undefined8 *in_RSI;
  buffer<char> *in_RDI;
  char in_R8B;
  int num_zeros;
  int num_zeros_3;
  int num_zeros_2;
  int exp;
  anon_class_40_7_ef14d3db write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  size_t size;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int local_198;
  int local_194;
  undefined2 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe72;
  undefined1 in_stack_fffffffffffffe73;
  undefined1 uVar4;
  undefined4 in_stack_fffffffffffffe74;
  int iVar5;
  size_t in_stack_fffffffffffffe78;
  basic_format_specs<char> *in_stack_fffffffffffffe80;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_fffffffffffffeb8;
  int local_c8;
  int local_6c;
  int local_64;
  int local_60;
  int local_5c;
  anon_class_12_2_f0c9b3c6 local_58;
  int local_4c;
  ulong local_48;
  uint local_40;
  int local_3c;
  undefined8 local_38;
  char local_29;
  int *local_28;
  undefined8 *local_20;
  float_specs local_18;
  buffer_appender<char> local_10;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_8;
  
  local_38 = *in_RSI;
  local_29 = in_R8B;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RCX;
  local_10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)in_RDI;
  local_3c = get_significand_size<double>((decimal_fp<double> *)0x281b91);
  local_40 = (uint)local_18._4_4_ >> 8 & 0xff;
  tVar2 = to_unsigned<int>(local_3c);
  local_48 = (ulong)(tVar2 + (local_40 != 0));
  local_58.output_exp = *(int *)(local_20 + 1) + local_3c + -1;
  local_58.fspecs = local_18;
  local_4c = local_58.output_exp;
  bVar1 = write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<double>,_char>
          ::anon_class_12_2_f0c9b3c6::operator()(&local_58);
  if (bVar1) {
    local_5c = 0;
    if (((uint)local_18._4_4_ >> 0x14 & 1) == 0) {
      if (local_3c == 1) {
        local_29 = '\0';
      }
    }
    else {
      local_60 = local_18.precision - local_3c;
      local_64 = 0;
      piVar3 = std::max<int>(&local_60,&local_64);
      local_5c = *piVar3;
      tVar2 = to_unsigned<int>(local_5c);
      local_48 = tVar2 + local_48;
    }
    iVar5 = local_4c;
    if (local_4c < 0) {
      iVar5 = -local_4c;
    }
    local_6c = 2;
    if ((99 < iVar5) && (local_6c = 3, 999 < iVar5)) {
      local_6c = 4;
    }
    tVar2 = to_unsigned<int>((local_29 != '\0') + 2 + local_6c);
    local_48 = tVar2 + local_48;
    uVar4 = 0x45;
    if ((local_18._4_4_ & 0x10000) == 0) {
      uVar4 = 0x65;
    }
    if (*local_28 < 1) {
      reserve<char>((buffer_appender<char>)in_stack_fffffffffffffe88.container,
                    (size_t)in_stack_fffffffffffffe80);
      it = write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<double>,_char>
           ::anon_class_40_7_ef14d3db::operator()
                     ((anon_class_40_7_ef14d3db *)
                      CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      (iterator)in_stack_fffffffffffffeb8.container);
      local_8.container =
           (buffer<char> *)base_iterator<fmt::v7::detail::buffer_appender<char>>(local_10,it);
    }
    else {
      local_8.container =
           (buffer<char> *)
           write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_&>
                     (in_stack_fffffffffffffe88.container,in_stack_fffffffffffffe80,
                      in_stack_fffffffffffffe78,
                      (anon_class_40_7_ef14d3db *)
                      CONCAT44(iVar5,CONCAT13(uVar4,CONCAT12(0x65,in_stack_fffffffffffffe70))));
    }
  }
  else {
    local_c8 = *(int *)(local_20 + 1) + local_3c;
    if (*(int *)(local_20 + 1) < 0) {
      if (local_c8 < 1) {
        local_c8 = -local_c8;
        if (((local_3c == 0) && (-1 < local_18.precision)) && (local_18.precision < local_c8)) {
          local_c8 = local_18.precision;
        }
        tVar2 = to_unsigned<int>(local_c8);
        local_48 = (tVar2 + 2) + local_48;
        local_8.container =
             (buffer<char> *)
             write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_4_>
                       ((buffer_appender<char>)&local_3c,
                        (basic_format_specs<char> *)&stack0xfffffffffffffeb4,(size_t)&local_40,
                        (anon_class_48_6_9afe1116 *)
                        CONCAT44(in_stack_fffffffffffffe74,
                                 CONCAT13(in_stack_fffffffffffffe73,
                                          CONCAT12(in_stack_fffffffffffffe72,
                                                   in_stack_fffffffffffffe70))));
      }
      else {
        if (((uint)local_18._4_4_ >> 0x14 & 1) == 0) {
          local_194 = 0;
        }
        else {
          local_194 = local_18.precision - local_3c;
        }
        if (local_194 < 1) {
          local_198 = 0;
        }
        else {
          local_198 = local_194;
        }
        tVar2 = to_unsigned<int>(local_198);
        local_48 = (tVar2 + 1) + local_48;
        local_8.container =
             (buffer<char> *)
             write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_3_>
                       (in_stack_fffffffffffffe88.container,in_stack_fffffffffffffe80,
                        in_stack_fffffffffffffe78,
                        (anon_class_48_6_48d028d1 *)
                        CONCAT44(in_stack_fffffffffffffe74,
                                 CONCAT13(in_stack_fffffffffffffe73,
                                          CONCAT12(in_stack_fffffffffffffe72,
                                                   in_stack_fffffffffffffe70))));
      }
    }
    else {
      tVar2 = to_unsigned<int>(*(int *)(local_20 + 1));
      local_48 = tVar2 + local_48;
      local_c8 = local_18.precision - local_c8;
      if (((uint)local_18._4_4_ >> 0x14 & 1) != 0) {
        if ((local_c8 < 1) && (local_18._4_1_ != '\x02')) {
          local_c8 = 1;
        }
        if (0 < local_c8) {
          tVar2 = to_unsigned<int>(local_c8);
          local_48 = tVar2 + local_48;
        }
      }
      local_8.container =
           (buffer<char> *)
           write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_2_>
                     (in_stack_fffffffffffffe88.container,in_stack_fffffffffffffe80,
                      in_stack_fffffffffffffe78,
                      (anon_class_56_7_a2a26a24 *)
                      CONCAT44(in_stack_fffffffffffffe74,
                               CONCAT13(in_stack_fffffffffffffe73,
                                        CONCAT12(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70
                                                ))));
    }
  }
  return (buffer_appender<char>)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_8.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}